

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

rf_texture2d *
rf_gen_texture_prefilter
          (rf_texture2d *__return_storage_ptr__,rf_shader shader,rf_texture2d cubemap,rf_int size)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  rf_shader shader_00;
  rf_shader shader_01;
  rf_shader shader_02;
  rf_mat mat;
  rf_mat mat_00;
  rf_int rVar17;
  rf_int rVar18;
  int iVar19;
  int iVar20;
  long lVar21;
  rf_shader *prVar22;
  undefined8 *puVar23;
  byte bVar24;
  float fVar25;
  undefined4 in_stack_fffffffffffffac8;
  undefined4 in_stack_fffffffffffffacc;
  undefined4 in_stack_fffffffffffffad0;
  undefined4 in_stack_fffffffffffffad4;
  undefined8 in_stack_fffffffffffffad8;
  undefined1 in_stack_fffffffffffffae0 [104];
  rf_texture2d *prefilter;
  rf_int i_1;
  float roughness;
  uint mip_height;
  uint mip_width;
  rf_int mip;
  undefined1 local_1e8 [8];
  rf_mat fbo_views [6];
  undefined1 auStack_60 [8];
  rf_mat fbo_projection;
  uint i;
  uint rbo;
  uint fbo;
  int roughness_loc;
  rf_int size_local;
  
  bVar24 = 0;
  _fbo = size;
  memset(__return_storage_ptr__,0,0x18);
  prVar22 = &shader;
  puVar23 = (undefined8 *)&stack0xfffffffffffffac8;
  for (lVar21 = 0x10; lVar21 != 0; lVar21 = lVar21 + -1) {
    *puVar23 = *(undefined8 *)prVar22;
    prVar22 = (rf_shader *)((long)prVar22 + (ulong)bVar24 * -0x10 + 8);
    puVar23 = puVar23 + (ulong)bVar24 * -2 + 1;
  }
  shader_00.locs[0] = in_stack_fffffffffffffacc;
  shader_00.id = in_stack_fffffffffffffac8;
  shader_00.locs[1] = in_stack_fffffffffffffad0;
  shader_00.locs[2] = in_stack_fffffffffffffad4;
  shader_00.locs[3] = (int)in_stack_fffffffffffffad8;
  shader_00.locs[4] = (int)((ulong)in_stack_fffffffffffffad8 >> 0x20);
  shader_00.locs[5] = in_stack_fffffffffffffae0._0_4_;
  shader_00.locs[6] = in_stack_fffffffffffffae0._4_4_;
  shader_00.locs[7] = in_stack_fffffffffffffae0._8_4_;
  shader_00.locs[8] = in_stack_fffffffffffffae0._12_4_;
  shader_00.locs[9] = in_stack_fffffffffffffae0._16_4_;
  shader_00.locs[10] = in_stack_fffffffffffffae0._20_4_;
  shader_00.locs[0xb] = in_stack_fffffffffffffae0._24_4_;
  shader_00.locs[0xc] = in_stack_fffffffffffffae0._28_4_;
  shader_00.locs[0xd] = in_stack_fffffffffffffae0._32_4_;
  shader_00.locs[0xe] = in_stack_fffffffffffffae0._36_4_;
  shader_00.locs[0xf] = in_stack_fffffffffffffae0._40_4_;
  shader_00.locs[0x10] = in_stack_fffffffffffffae0._44_4_;
  shader_00.locs[0x11] = in_stack_fffffffffffffae0._48_4_;
  shader_00.locs[0x12] = in_stack_fffffffffffffae0._52_4_;
  shader_00.locs[0x13] = in_stack_fffffffffffffae0._56_4_;
  shader_00.locs[0x14] = in_stack_fffffffffffffae0._60_4_;
  shader_00.locs[0x15] = in_stack_fffffffffffffae0._64_4_;
  shader_00.locs[0x16] = in_stack_fffffffffffffae0._68_4_;
  shader_00.locs[0x17] = in_stack_fffffffffffffae0._72_4_;
  shader_00.locs[0x18] = in_stack_fffffffffffffae0._76_4_;
  shader_00.locs[0x19] = in_stack_fffffffffffffae0._80_4_;
  shader_00.locs[0x1a] = in_stack_fffffffffffffae0._84_4_;
  shader_00.locs[0x1b] = in_stack_fffffffffffffae0._88_4_;
  shader_00.locs[0x1c] = in_stack_fffffffffffffae0._92_4_;
  shader_00.locs[0x1d] = in_stack_fffffffffffffae0._96_4_;
  shader_00.locs[0x1e] = in_stack_fffffffffffffae0._100_4_;
  shader_00.locs[0x1f] = shader.locs[0x1f];
  rbo = rf_gfx_get_shader_location(shader_00,"roughness");
  (*(rf__ctx->field_0).gfx_ctx.gl.GenFramebuffers)(1,&i);
  (*(rf__ctx->field_0).gfx_ctx.gl.GenRenderbuffers)(1,(uint *)&fbo_projection.m15);
  (*(rf__ctx->field_0).gfx_ctx.gl.BindFramebuffer)(0x8d40,i);
  (*(rf__ctx->field_0).gfx_ctx.gl.BindRenderbuffer)(0x8d41,(uint)fbo_projection.m15);
  (*(rf__ctx->field_0).gfx_ctx.gl.RenderbufferStorage)(0x8d41,0x81a6,(int)_fbo,(int)_fbo);
  (*(rf__ctx->field_0).gfx_ctx.gl.FramebufferRenderbuffer)
            (0x8d40,0x8d00,0x8d41,(uint)fbo_projection.m15);
  (*(rf__ctx->field_0).gfx_ctx.gl.GenTextures)(1,&__return_storage_ptr__->id);
  (*(rf__ctx->field_0).gfx_ctx.gl.BindTexture)(0x8513,__return_storage_ptr__->id);
  for (fbo_projection.m11 = 0.0; (uint)fbo_projection.m11 < 6;
      fbo_projection.m11 = (float)((int)fbo_projection.m11 + 1)) {
    in_stack_fffffffffffffac8 = 0x1907;
    in_stack_fffffffffffffad0 = 0x1406;
    in_stack_fffffffffffffad8 = 0;
    (*(rf__ctx->field_0).gfx_ctx.gl.TexImage2D)
              ((int)fbo_projection.m11 + 0x8515,0,0x881b,(int)_fbo,(int)_fbo,0,0x1907,0x1406,
               (void *)0x0);
  }
  (*(rf__ctx->field_0).gfx_ctx.gl.TexParameteri)(0x8513,0x2802,0x812f);
  (*(rf__ctx->field_0).gfx_ctx.gl.TexParameteri)(0x8513,0x2803,0x812f);
  (*(rf__ctx->field_0).gfx_ctx.gl.TexParameteri)(0x8513,0x8072,0x812f);
  (*(rf__ctx->field_0).gfx_ctx.gl.TexParameteri)(0x8513,0x2801,0x2703);
  (*(rf__ctx->field_0).gfx_ctx.gl.TexParameteri)(0x8513,0x2800,0x2601);
  (*(rf__ctx->field_0).gfx_ctx.gl.GenerateMipmap)(0x8513);
  rf_mat_perspective((rf_mat *)auStack_60,1.5707963146269321,1.0,0.01,1000.0);
  rf_mat_look_at((rf_mat *)local_1e8,(rf_vec3)ZEXT812(0),(rf_vec3)ZEXT812(0x3f800000),
                 (rf_vec3)ZEXT812(0xbf80000000000000));
  rf_mat_look_at((rf_mat *)&fbo_views[0].m11,(rf_vec3)ZEXT812(0),(rf_vec3)ZEXT812(0xbf800000),
                 (rf_vec3)ZEXT812(0xbf80000000000000));
  rf_mat_look_at((rf_mat *)&fbo_views[1].m11,(rf_vec3)ZEXT812(0),
                 (rf_vec3)ZEXT812(0x3f80000000000000),(rf_vec3)(ZEXT412(0x3f800000) << 0x40));
  rf_mat_look_at((rf_mat *)&fbo_views[2].m11,(rf_vec3)ZEXT812(0),
                 (rf_vec3)ZEXT812(0xbf80000000000000),(rf_vec3)(ZEXT412(0xbf800000) << 0x40));
  rf_mat_look_at((rf_mat *)&fbo_views[3].m11,(rf_vec3)ZEXT812(0),
                 (rf_vec3)(ZEXT412(0x3f800000) << 0x40),(rf_vec3)ZEXT812(0xbf80000000000000));
  rf_mat_look_at((rf_mat *)&fbo_views[4].m11,(rf_vec3)ZEXT812(0),
                 (rf_vec3)(ZEXT412(0xbf800000) << 0x40),(rf_vec3)ZEXT812(0xbf80000000000000));
  (*(rf__ctx->field_0).gfx_ctx.gl.UseProgram)(shader.id);
  (*(rf__ctx->field_0).gfx_ctx.gl.ActiveTexture)(0x84c0);
  (*(rf__ctx->field_0).gfx_ctx.gl.BindTexture)(0x8513,cubemap.id);
  prVar22 = &shader;
  puVar23 = (undefined8 *)&stack0xfffffffffffffac8;
  for (lVar21 = 0x10; lVar21 != 0; lVar21 = lVar21 + -1) {
    *puVar23 = *(undefined8 *)prVar22;
    prVar22 = (rf_shader *)((long)prVar22 + (ulong)bVar24 * -0x10 + 8);
    puVar23 = puVar23 + (ulong)bVar24 * -2 + 1;
  }
  shader_01.locs[0] = in_stack_fffffffffffffacc;
  shader_01.id = in_stack_fffffffffffffac8;
  shader_01.locs[1] = in_stack_fffffffffffffad0;
  shader_01.locs[2] = in_stack_fffffffffffffad4;
  shader_01.locs[3] = (int)in_stack_fffffffffffffad8;
  shader_01.locs[4] = (int)((ulong)in_stack_fffffffffffffad8 >> 0x20);
  shader_01.locs[5] = in_stack_fffffffffffffae0._0_4_;
  shader_01.locs[6] = in_stack_fffffffffffffae0._4_4_;
  shader_01.locs[7] = in_stack_fffffffffffffae0._8_4_;
  shader_01.locs[8] = in_stack_fffffffffffffae0._12_4_;
  shader_01.locs[9] = in_stack_fffffffffffffae0._16_4_;
  shader_01.locs[10] = in_stack_fffffffffffffae0._20_4_;
  shader_01.locs[0xb] = in_stack_fffffffffffffae0._24_4_;
  shader_01.locs[0xc] = in_stack_fffffffffffffae0._28_4_;
  shader_01.locs[0xd] = in_stack_fffffffffffffae0._32_4_;
  shader_01.locs[0xe] = in_stack_fffffffffffffae0._36_4_;
  shader_01.locs[0xf] = in_stack_fffffffffffffae0._40_4_;
  shader_01.locs[0x10] = in_stack_fffffffffffffae0._44_4_;
  shader_01.locs[0x11] = in_stack_fffffffffffffae0._48_4_;
  shader_01.locs[0x12] = in_stack_fffffffffffffae0._52_4_;
  shader_01.locs[0x13] = in_stack_fffffffffffffae0._56_4_;
  shader_01.locs[0x14] = in_stack_fffffffffffffae0._60_4_;
  shader_01.locs[0x15] = in_stack_fffffffffffffae0._64_4_;
  shader_01.locs[0x16] = in_stack_fffffffffffffae0._68_4_;
  shader_01.locs[0x17] = in_stack_fffffffffffffae0._72_4_;
  shader_01.locs[0x18] = in_stack_fffffffffffffae0._76_4_;
  shader_01.locs[0x19] = in_stack_fffffffffffffae0._80_4_;
  shader_01.locs[0x1a] = in_stack_fffffffffffffae0._84_4_;
  shader_01.locs[0x1b] = in_stack_fffffffffffffae0._88_4_;
  shader_01.locs[0x1c] = in_stack_fffffffffffffae0._92_4_;
  shader_01.locs[0x1d] = in_stack_fffffffffffffae0._96_4_;
  shader_01.locs[0x1e] = in_stack_fffffffffffffae0._100_4_;
  shader_01.locs[0x1f] = shader.locs[0x1f];
  mat.m8 = fbo_projection.m0;
  mat.m12 = fbo_projection.m4;
  mat.m0 = (float)auStack_60._0_4_;
  mat.m4 = (float)auStack_60._4_4_;
  mat.m1 = fbo_projection.m8;
  mat.m5 = fbo_projection.m12;
  mat.m9 = fbo_projection.m1;
  mat.m13 = fbo_projection.m5;
  mat.m2 = fbo_projection.m9;
  mat.m6 = fbo_projection.m13;
  mat.m10 = fbo_projection.m2;
  mat.m14 = fbo_projection.m6;
  mat.m3 = fbo_projection.m10;
  mat.m7 = fbo_projection.m14;
  mat.m11 = fbo_projection.m3;
  mat.m15 = fbo_projection.m7;
  rf_gfx_set_shader_value_matrix(shader_01,shader.locs[9],mat);
  (*(rf__ctx->field_0).gfx_ctx.gl.BindFramebuffer)(0x8d40,i);
  for (_mip_height = 0; rVar17 = _fbo, _mip_height < 5; _mip_height = _mip_height + 1) {
    fVar25 = powf(0.5,(float)_mip_height);
    rVar18 = _fbo;
    iVar19 = (int)rVar17 * (int)fVar25;
    fVar25 = powf(0.5,(float)_mip_height);
    iVar20 = (int)rVar18 * (int)fVar25;
    (*(rf__ctx->field_0).gfx_ctx.gl.BindRenderbuffer)(0x8d41,(uint)fbo_projection.m15);
    (*(rf__ctx->field_0).gfx_ctx.gl.RenderbufferStorage)(0x8d41,0x81a6,iVar19,iVar20);
    (*(rf__ctx->field_0).gfx_ctx.gl.Viewport)(0,0,iVar19,iVar20);
    (*(rf__ctx->field_0).gfx_ctx.gl.Uniform1f)(rbo,(float)_mip_height / 4.0);
    for (prefilter = (rf_texture2d *)0x0; (long)prefilter < 6;
        prefilter = (rf_texture2d *)((long)&prefilter->id + 1)) {
      prVar22 = &shader;
      puVar23 = (undefined8 *)&stack0xfffffffffffffac8;
      for (lVar21 = 0x10; lVar21 != 0; lVar21 = lVar21 + -1) {
        *puVar23 = *(undefined8 *)prVar22;
        prVar22 = (rf_shader *)((long)prVar22 + (ulong)bVar24 * -0x10 + 8);
        puVar23 = puVar23 + (ulong)bVar24 * -2 + 1;
      }
      uVar1 = fbo_views[(long)&prefilter[-1].field_0x17].m11;
      uVar2 = fbo_views[(long)&prefilter[-1].field_0x17].m15;
      mat_00.m4 = (float)uVar2;
      mat_00.m0 = (float)uVar1;
      uVar3 = fbo_views[(long)prefilter].m0;
      uVar4 = fbo_views[(long)prefilter].m4;
      mat_00.m12 = (float)uVar4;
      mat_00.m8 = (float)uVar3;
      uVar5 = fbo_views[(long)prefilter].m8;
      uVar6 = fbo_views[(long)prefilter].m12;
      mat_00.m5 = (float)uVar6;
      mat_00.m1 = (float)uVar5;
      uVar7 = fbo_views[(long)prefilter].m1;
      uVar8 = fbo_views[(long)prefilter].m5;
      mat_00.m13 = (float)uVar8;
      mat_00.m9 = (float)uVar7;
      uVar9 = fbo_views[(long)prefilter].m9;
      uVar10 = fbo_views[(long)prefilter].m13;
      mat_00.m6 = (float)uVar10;
      mat_00.m2 = (float)uVar9;
      uVar11 = fbo_views[(long)prefilter].m2;
      uVar12 = fbo_views[(long)prefilter].m6;
      mat_00.m14 = (float)uVar12;
      mat_00.m10 = (float)uVar11;
      uVar13 = fbo_views[(long)prefilter].m10;
      uVar14 = fbo_views[(long)prefilter].m14;
      mat_00.m7 = (float)uVar14;
      mat_00.m3 = (float)uVar13;
      uVar15 = fbo_views[(long)prefilter].m3;
      uVar16 = fbo_views[(long)prefilter].m7;
      mat_00.m15 = (float)uVar16;
      mat_00.m11 = (float)uVar15;
      shader_02.locs[0] = in_stack_fffffffffffffacc;
      shader_02.id = in_stack_fffffffffffffac8;
      shader_02.locs[1] = in_stack_fffffffffffffad0;
      shader_02.locs[2] = in_stack_fffffffffffffad4;
      shader_02.locs[3] = (int)in_stack_fffffffffffffad8;
      shader_02.locs[4] = (int)((ulong)in_stack_fffffffffffffad8 >> 0x20);
      shader_02.locs[5] = in_stack_fffffffffffffae0._0_4_;
      shader_02.locs[6] = in_stack_fffffffffffffae0._4_4_;
      shader_02.locs[7] = in_stack_fffffffffffffae0._8_4_;
      shader_02.locs[8] = in_stack_fffffffffffffae0._12_4_;
      shader_02.locs[9] = in_stack_fffffffffffffae0._16_4_;
      shader_02.locs[10] = in_stack_fffffffffffffae0._20_4_;
      shader_02.locs[0xb] = in_stack_fffffffffffffae0._24_4_;
      shader_02.locs[0xc] = in_stack_fffffffffffffae0._28_4_;
      shader_02.locs[0xd] = in_stack_fffffffffffffae0._32_4_;
      shader_02.locs[0xe] = in_stack_fffffffffffffae0._36_4_;
      shader_02.locs[0xf] = in_stack_fffffffffffffae0._40_4_;
      shader_02.locs[0x10] = in_stack_fffffffffffffae0._44_4_;
      shader_02.locs[0x11] = in_stack_fffffffffffffae0._48_4_;
      shader_02.locs[0x12] = in_stack_fffffffffffffae0._52_4_;
      shader_02.locs[0x13] = in_stack_fffffffffffffae0._56_4_;
      shader_02.locs[0x14] = in_stack_fffffffffffffae0._60_4_;
      shader_02.locs[0x15] = in_stack_fffffffffffffae0._64_4_;
      shader_02.locs[0x16] = in_stack_fffffffffffffae0._68_4_;
      shader_02.locs[0x17] = in_stack_fffffffffffffae0._72_4_;
      shader_02.locs[0x18] = in_stack_fffffffffffffae0._76_4_;
      shader_02.locs[0x19] = in_stack_fffffffffffffae0._80_4_;
      shader_02.locs[0x1a] = in_stack_fffffffffffffae0._84_4_;
      shader_02.locs[0x1b] = in_stack_fffffffffffffae0._88_4_;
      shader_02.locs[0x1c] = in_stack_fffffffffffffae0._92_4_;
      shader_02.locs[0x1d] = in_stack_fffffffffffffae0._96_4_;
      shader_02.locs[0x1e] = in_stack_fffffffffffffae0._100_4_;
      shader_02.locs[0x1f] = shader.locs[0x1f];
      rf_gfx_set_shader_value_matrix(shader_02,shader.locs[8],mat_00);
      (*(rf__ctx->field_0).gfx_ctx.gl.FramebufferTexture2D)
                (0x8d40,0x8ce0,(int)prefilter + 0x8515,__return_storage_ptr__->id,(int)_mip_height);
      (*(rf__ctx->field_0).gfx_ctx.gl.Clear)(0x4100);
      rf_gen_draw_cube();
    }
  }
  (*(rf__ctx->field_0).gfx_ctx.gl.BindFramebuffer)(0x8d40,0);
  (*(rf__ctx->field_0).gfx_ctx.gl.Viewport)
            (0,0,(rf__ctx->field_0).framebuffer_width,(rf__ctx->field_0).framebuffer_height);
  __return_storage_ptr__->width = (int)_fbo;
  __return_storage_ptr__->height = (int)_fbo;
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_texture2d rf_gen_texture_prefilter(rf_shader shader, rf_texture2d cubemap, rf_int size)
{
    rf_texture2d prefilter = { 0 };

    // NOTE: rf_set_shader_default_locations() already setups locations for projection and view rf_mat in shader
    // Other locations should be setup externally in shader before calling the function
    // TODO: Locations should be taken out of this function... too shader dependant...
    int roughness_loc = rf_gfx_get_shader_location(shader, "roughness");

    // Setup framebuffer
    unsigned int fbo, rbo;
    rf_gl.GenFramebuffers(1, &fbo);
    rf_gl.GenRenderbuffers(1, &rbo);
    rf_gl.BindFramebuffer(GL_FRAMEBUFFER, fbo);
    rf_gl.BindRenderbuffer(GL_RENDERBUFFER, rbo);
    rf_gl.RenderbufferStorage(GL_RENDERBUFFER, GL_DEPTH_COMPONENT24, size, size);
    rf_gl.FramebufferRenderbuffer(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_RENDERBUFFER, rbo);

    // Create a prefiltered HDR environment map
    rf_gl.GenTextures(1, &prefilter.id);
    rf_gl.BindTexture(GL_TEXTURE_CUBE_MAP, prefilter.id);
    for (unsigned int i = 0; i < 6; i++)
    {
        rf_gl.TexImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_X + i, 0, GL_RGB16F, size, size, 0, GL_RGB, GL_FLOAT, NULL);
    }

    rf_gl.TexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
    rf_gl.TexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);
    rf_gl.TexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_R, GL_CLAMP_TO_EDGE);
    rf_gl.TexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MIN_FILTER, GL_LINEAR_MIPMAP_LINEAR);
    rf_gl.TexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MAG_FILTER, GL_LINEAR);

    // Generate mipmaps for the prefiltered HDR texture
    rf_gl.GenerateMipmap(GL_TEXTURE_CUBE_MAP);

    // Create rf_ctx->gl_ctx.projection (transposed) and different views for each face
    rf_mat fbo_projection = rf_mat_perspective(90.0 * RF_DEG2RAD, 1.0, 0.01, 1000.0);
    rf_mat fbo_views[6] = {
            rf_mat_look_at((rf_vec3) {0.0f, 0.0f, 0.0f}, (rf_vec3) {1.0f, 0.0f, 0.0f}, (rf_vec3) {0.0f, -1.0f, 0.0f}),
            rf_mat_look_at((rf_vec3) {0.0f, 0.0f, 0.0f}, (rf_vec3) {-1.0f, 0.0f, 0.0f}, (rf_vec3) {0.0f, -1.0f, 0.0f}),
            rf_mat_look_at((rf_vec3) {0.0f, 0.0f, 0.0f}, (rf_vec3) {0.0f, 1.0f, 0.0f}, (rf_vec3) {0.0f, 0.0f, 1.0f}),
            rf_mat_look_at((rf_vec3) {0.0f, 0.0f, 0.0f}, (rf_vec3) {0.0f, -1.0f, 0.0f}, (rf_vec3) {0.0f, 0.0f, -1.0f}),
            rf_mat_look_at((rf_vec3) {0.0f, 0.0f, 0.0f}, (rf_vec3) {0.0f, 0.0f, 1.0f}, (rf_vec3) {0.0f, -1.0f, 0.0f}),
            rf_mat_look_at((rf_vec3) {0.0f, 0.0f, 0.0f}, (rf_vec3) {0.0f, 0.0f, -1.0f}, (rf_vec3) {0.0f, -1.0f, 0.0f})
    };

    // Prefilter HDR and store data into mipmap levels
    rf_gl.UseProgram(shader.id);
    rf_gl.ActiveTexture(GL_TEXTURE0);
    rf_gl.BindTexture(GL_TEXTURE_CUBE_MAP, cubemap.id);
    rf_gfx_set_shader_value_matrix(shader, shader.locs[RF_LOC_MATRIX_PROJECTION], fbo_projection);

    rf_gl.BindFramebuffer(GL_FRAMEBUFFER, fbo);

#define MAX_MIPMAP_LEVELS   5   // Max number of prefilter texture mipmaps

    for (rf_int mip = 0; mip < MAX_MIPMAP_LEVELS; mip++)
    {
        // Resize framebuffer according to mip-level size.
        unsigned int mip_width  = size*(int)powf(0.5f, (float)mip);
        unsigned int mip_height = size*(int)powf(0.5f, (float)mip);

        rf_gl.BindRenderbuffer(GL_RENDERBUFFER, rbo);
        rf_gl.RenderbufferStorage(GL_RENDERBUFFER, GL_DEPTH_COMPONENT24, mip_width, mip_height);
        rf_gl.Viewport(0, 0, mip_width, mip_height);

        float roughness = (float)mip/(float)(MAX_MIPMAP_LEVELS - 1);
        rf_gl.Uniform1f(roughness_loc, roughness);

        for (rf_int i = 0; i < 6; i++)
        {
            rf_gfx_set_shader_value_matrix(shader, shader.locs[RF_LOC_MATRIX_VIEW], fbo_views[i]);
            rf_gl.FramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_CUBE_MAP_POSITIVE_X + i, prefilter.id, mip);
            rf_gl.Clear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);
            rf_gen_draw_cube();
        }
    }

    // Unbind framebuffer and textures
    rf_gl.BindFramebuffer(GL_FRAMEBUFFER, 0);

    // Reset viewport dimensions to default
    rf_gl.Viewport(0, 0, rf_ctx.framebuffer_width, rf_ctx.framebuffer_height);

    prefilter.width = size;
    prefilter.height = size;
    //prefilter.mipmaps = 1 + (int)floor(log(size)/log(2));
    //prefilter.format = UNCOMPRESSED_R16G16B16;

    return prefilter;
}